

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O3

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createFullscreenQuad(void)

{
  vector<vkt::pipeline::Vertex4Tex4,std::allocator<vkt::pipeline::Vertex4Tex4>> *in_RDI;
  Vertex4Tex4 vertices [6];
  allocator_type local_c9;
  Vertex4Tex4 local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_c8.position.m_data[0] = -1.0;
  local_c8.position.m_data[1] = -1.0;
  local_c8.position.m_data[2] = 0.0;
  local_c8.position.m_data[3] = 1.0;
  local_c8.texCoord.m_data[0] = 0.0;
  local_c8.texCoord.m_data[1] = 0.0;
  local_c8.texCoord.m_data[2] = 0.0;
  local_c8.texCoord.m_data[3] = 0.0;
  local_a8 = 0xbf8000003f800000;
  uStack_a0 = 0x3f80000000000000;
  local_98 = 0x3f800000;
  uStack_90 = 0;
  local_88 = 0x3f800000bf800000;
  uStack_80 = 0x3f80000000000000;
  local_78 = 0x3f80000000000000;
  uStack_70 = 0;
  local_68 = 0x3f800000bf800000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0x3f80000000000000;
  uStack_50 = 0;
  local_48 = 0xbf8000003f800000;
  uStack_40 = 0x3f80000000000000;
  local_38 = 0x3f800000;
  uStack_30 = 0;
  local_28 = 0x3f8000003f800000;
  uStack_20 = 0x3f80000000000000;
  local_18 = 0x3f8000003f800000;
  uStack_10 = 0;
  std::vector<vkt::pipeline::Vertex4Tex4,std::allocator<vkt::pipeline::Vertex4Tex4>>::
  vector<vkt::pipeline::Vertex4Tex4_const*,void>
            (in_RDI,&local_c8,(Vertex4Tex4 *)&stack0xfffffffffffffff8,&local_c9);
  return (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)in_RDI;
}

Assistant:

std::vector<Vertex4Tex4> createFullscreenQuad (void)
{
	using tcu::Vec4;

	const Vertex4Tex4 lowerLeftVertex =
	{
		Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		Vec4(0.0f, 0.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 upperLeftVertex =
	{
		Vec4(-1.0f, 1.0f, 0.0f, 1.0f),
		Vec4(0.0f, 1.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 lowerRightVertex =
	{
		Vec4(1.0f, -1.0f, 0.0f, 1.0f),
		Vec4(1.0f, 0.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 upperRightVertex =
	{
		Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		Vec4(1.0f, 1.0f, 0.0f, 0.0f)
	};

	const Vertex4Tex4 vertices[6] =
	{
		lowerLeftVertex,
		lowerRightVertex,
		upperLeftVertex,

		upperLeftVertex,
		lowerRightVertex,
		upperRightVertex
	};

	return std::vector<Vertex4Tex4>(vertices, vertices + DE_LENGTH_OF_ARRAY(vertices));
}